

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::AliasingBarrier
          (DeviceContextVkImpl *this,IDeviceObject *pResourceBefore,IDeviceObject *pResourceAfter)

{
  BIND_FLAGS BVar1;
  IDeviceObject *pResource;
  VkAccessFlags vkDstAccessMask;
  VkPipelineStageFlags vkDstStages;
  VkAccessFlags vkSrcAccessMask;
  VkPipelineStageFlags vkSrcStages;
  VkAccessFlags local_40;
  VkPipelineStageFlags local_3c;
  VkAccessFlags local_38;
  VkPipelineStageFlags local_34;
  
  pResource = (IDeviceObject *)&local_34;
  local_34 = 0;
  local_38 = 0;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)pResourceBefore,pResourceBefore);
  GetAllowedStagesAndAccessMask(BVar1,(VkPipelineStageFlags *)pResource,&local_38);
  local_3c = 0;
  local_40 = 0;
  BVar1 = AliasingBarrier::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)pResourceAfter,pResource);
  GetAllowedStagesAndAccessMask(BVar1,&local_3c,&local_40);
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
            (&this->m_CommandBuffer,local_38,local_40,local_34,local_3c);
  return;
}

Assistant:

void DeviceContextVkImpl::AliasingBarrier(IDeviceObject* pResourceBefore, IDeviceObject* pResourceAfter)
{
    auto GetResourceBindFlags = [](IDeviceObject* pResource) //
    {
        if (RefCntAutoPtr<ITextureVk> pTexture{pResource, IID_TextureVk})
        {
            return pTexture.RawPtr<TextureVkImpl>()->GetDesc().BindFlags;
        }
        else if (RefCntAutoPtr<IBufferVk> pBuffer{pResource, IID_BufferVk})
        {
            return pBuffer.RawPtr<BufferVkImpl>()->GetDesc().BindFlags;
        }
        else
        {
            constexpr BIND_FLAGS BindAll = static_cast<BIND_FLAGS>((Uint32{BIND_FLAG_LAST} << 1) - 1);
            return BindAll;
        }
    };

    VkPipelineStageFlags vkSrcStages     = 0;
    VkAccessFlags        vkSrcAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceBefore), vkSrcStages, vkSrcAccessMask);

    VkPipelineStageFlags vkDstStages     = 0;
    VkAccessFlags        vkDstAccessMask = 0;
    GetAllowedStagesAndAccessMask(GetResourceBindFlags(pResourceAfter), vkDstStages, vkDstAccessMask);

    EnsureVkCmdBuffer();
    m_CommandBuffer.MemoryBarrier(vkSrcAccessMask, vkDstAccessMask, vkSrcStages, vkDstStages);
}